

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O3

void __thiscall
QTriangulator<unsigned_short>::MonotoneToTriangles::decompose(MonotoneToTriangles *this)

{
  undefined1 *puVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  unsigned_short *puVar5;
  QPodPoint *pQVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  QTriangulator<unsigned_short> *pQVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  long in_FS_OFFSET;
  QDataBuffer<int> local_78;
  QArrayDataPointer<unsigned_short> local_58;
  ushort local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (unsigned_short *)0x0;
  local_58.size = 0;
  local_78.buffer = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.capacity = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.siz = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QDataBuffer<int>::QDataBuffer(&local_78,(this->m_parent->m_indices).d.size);
  this->m_first = 0;
  pQVar17 = this->m_parent;
  if (2 < (ulong)(pQVar17->m_indices).d.size) {
    iVar13 = 0;
    do {
      puVar5 = (pQVar17->m_indices).d.ptr;
      uVar11 = 0;
      do {
        uVar10 = uVar11;
        uVar11 = uVar10 + 1;
      } while (puVar5[(long)iVar13 + uVar10] != 0xffff);
      iVar19 = (int)uVar10;
      this->m_length = iVar19;
      iVar20 = (int)(uVar10 + 1);
      if (uVar10 < 3) {
        iVar13 = iVar13 + iVar20;
      }
      else {
        pQVar6 = (pQVar17->m_vertices).buffer;
        uVar11 = 0;
        do {
          uVar10 = uVar11;
          uVar11 = (long)((int)uVar10 + 1) % (long)iVar19;
          bVar7 = pQVar6[puVar5[(int)uVar11 + iVar13]].y < pQVar6[puVar5[(int)uVar10 + iVar13]].y;
          if (pQVar6[puVar5[(int)uVar11 + iVar13]].y == pQVar6[puVar5[(int)uVar10 + iVar13]].y) {
            bVar7 = pQVar6[puVar5[(int)uVar11 + iVar13]].x < pQVar6[puVar5[(int)uVar10 + iVar13]].x;
          }
          uVar11 = uVar11 & 0xffffffff;
        } while (bVar7);
        do {
          iVar22 = (int)uVar10;
          uVar11 = (long)(iVar20 + -2 + iVar22) % (long)iVar19;
          uVar10 = uVar11 & 0xffffffff;
          bVar7 = pQVar6[puVar5[(int)uVar11 + iVar13]].y < pQVar6[puVar5[iVar22 + iVar13]].y;
          if (pQVar6[puVar5[(int)uVar11 + iVar13]].y == pQVar6[puVar5[iVar22 + iVar13]].y) {
            bVar7 = pQVar6[puVar5[(int)uVar11 + iVar13]].x < pQVar6[puVar5[iVar22 + iVar13]].x;
          }
        } while (bVar7);
        local_78.siz = 0;
        QDataBuffer<int>::reserve(&local_78,1);
        local_78.buffer[local_78.siz] = iVar22;
        iVar13 = this->m_length;
        uVar11 = (long)(iVar22 + -1 + iVar13) % (long)iVar13;
        uVar10 = (long)(iVar22 + 1) % (long)iVar13;
        iVar13 = this->m_first;
        pQVar6 = (this->m_parent->m_vertices).buffer;
        puVar5 = (this->m_parent->m_indices).d.ptr;
        iVar18 = (int)uVar11;
        iVar12 = (int)uVar10;
        iVar20 = pQVar6[puVar5[iVar22 + iVar13]].x;
        iVar19 = pQVar6[puVar5[iVar22 + iVar13]].y;
        iVar22 = pQVar6[puVar5[iVar18 + iVar13]].x;
        iVar4 = pQVar6[puVar5[iVar18 + iVar13]].y;
        iVar21 = pQVar6[puVar5[iVar13 + iVar12]].x - iVar22;
        iVar9 = pQVar6[puVar5[iVar13 + iVar12]].y - iVar4;
        bVar7 = iVar9 != 0 && iVar4 <= pQVar6[puVar5[iVar13 + iVar12]].y;
        if (iVar9 == 0) {
          bVar7 = iVar21 != 0 && iVar22 <= pQVar6[puVar5[iVar13 + iVar12]].x;
        }
        lVar14 = local_78.siz + 2;
        local_78.siz = local_78.siz + 1;
        QDataBuffer<int>::reserve(&local_78,lVar14);
        if (!bVar7) {
          local_78.buffer[local_78.siz] = iVar12;
          iVar13 = this->m_length;
          uVar10 = (long)(iVar12 + 1) % (long)iVar13;
        }
        else {
          local_78.buffer[local_78.siz] = iVar18;
          iVar13 = this->m_length;
          uVar11 = (long)(iVar18 + iVar13 + -1) % (long)iVar13;
        }
        uVar11 = uVar11 & 0xffffffff;
        uVar10 = uVar10 & 0xffffffff;
        bVar7 = bVar7;
        local_78.siz = local_78.siz + 1;
        if (2 < iVar13) {
          lVar14 = (long)iVar21 * ((long)iVar19 - (long)iVar4);
          lVar15 = (long)iVar9 * ((long)iVar20 - (long)iVar22);
          iVar20 = 0;
          do {
            iVar19 = (int)uVar11;
            pQVar6 = (this->m_parent->m_vertices).buffer;
            puVar5 = (this->m_parent->m_indices).d.ptr;
            uVar2 = puVar5[this->m_first + iVar19];
            iVar22 = (int)uVar10;
            uVar3 = puVar5[this->m_first + iVar22];
            bVar8 = pQVar6[uVar2].y < pQVar6[uVar3].y;
            if (pQVar6[uVar2].y == pQVar6[uVar3].y) {
              bVar8 = pQVar6[uVar2].x < pQVar6[uVar3].x;
            }
            if (bVar8) {
              if (bVar7) {
                if (1 < local_78.siz) {
                  do {
                    lVar16 = (long)this->m_first;
                    pQVar6 = (this->m_parent->m_vertices).buffer;
                    puVar5 = (this->m_parent->m_indices).d.ptr;
                    uVar2 = puVar5[local_78.buffer[(long)(local_78.siz + -2)] + lVar16];
                    if (((long)pQVar6[puVar5[lVar16 + iVar19]].y - (long)pQVar6[uVar2].y) *
                        ((long)pQVar6[puVar5[local_78.buffer[(long)(local_78.siz + -1)] + lVar16]].x
                        - (long)pQVar6[uVar2].x) <
                        ((long)pQVar6[puVar5[lVar16 + iVar19]].x - (long)pQVar6[uVar2].x) *
                        ((long)pQVar6[puVar5[local_78.buffer[(long)(local_78.siz + -1)] + lVar16]].y
                        - (long)pQVar6[uVar2].y) != lVar14 < lVar15) break;
                    local_3a = uVar2;
                    QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                              ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                    QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                    local_3a = (this->m_parent->m_indices).d.ptr[(long)this->m_first + (long)iVar19]
                    ;
                    QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                              ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                    QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                    local_3a = (this->m_parent->m_indices).d.ptr
                               [(long)this->m_first +
                                (long)local_78.buffer[(long)(local_78.siz + -1)]];
                    QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                              ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                    QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                    puVar1 = (undefined1 *)(local_78.siz + -1);
                    bVar7 = 2 < local_78.siz;
                    local_78.siz = (qsizetype)puVar1;
                  } while (bVar7);
                }
              }
              else {
                if (1 < local_78.siz) {
                  lVar16 = 1;
                  do {
                    local_3a = (this->m_parent->m_indices).d.ptr
                               [(long)this->m_first + (long)local_78.buffer[lVar16]];
                    QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                              ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                    QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                    local_3a = (this->m_parent->m_indices).d.ptr[(long)this->m_first + (long)iVar19]
                    ;
                    QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                              ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                    QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                    local_3a = (this->m_parent->m_indices).d.ptr
                               [(long)this->m_first + (long)local_78.buffer[lVar16 + -1]];
                    QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                              ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                    QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 < local_78.siz);
                }
                *local_78.buffer = local_78.buffer[(long)(local_78.siz + -1)];
                QDataBuffer<int>::reserve(&local_78,1);
                local_78.siz = 1;
              }
              QDataBuffer<int>::reserve(&local_78,(qsizetype)(local_78.siz + 1));
              local_78.buffer[local_78.siz] = iVar19;
              iVar13 = this->m_length;
              uVar11 = (long)(iVar19 + iVar13 + -1) % (long)iVar13 & 0xffffffff;
              bVar7 = true;
            }
            else {
              if (bVar7) {
                if (1 < local_78.siz) {
                  lVar16 = 1;
                  do {
                    local_3a = (this->m_parent->m_indices).d.ptr
                               [(long)this->m_first + (long)local_78.buffer[lVar16 + -1]];
                    QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                              ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                    QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                    local_3a = (this->m_parent->m_indices).d.ptr[(long)this->m_first + (long)iVar22]
                    ;
                    QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                              ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                    QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                    local_3a = (this->m_parent->m_indices).d.ptr
                               [(long)this->m_first + (long)local_78.buffer[lVar16]];
                    QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                              ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                    QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 < local_78.siz);
                }
                *local_78.buffer = local_78.buffer[(long)(local_78.siz + -1)];
                QDataBuffer<int>::reserve(&local_78,1);
                local_78.siz = 1;
              }
              else if (1 < local_78.siz) {
                do {
                  lVar16 = (long)this->m_first;
                  pQVar6 = (this->m_parent->m_vertices).buffer;
                  puVar5 = (this->m_parent->m_indices).d.ptr;
                  uVar2 = puVar5[local_78.buffer[(long)(local_78.siz + -1)] + lVar16];
                  if (((long)pQVar6[puVar5[lVar16 + iVar22]].y - (long)pQVar6[uVar2].y) *
                      ((long)pQVar6[puVar5[local_78.buffer[(long)(local_78.siz + -2)] + lVar16]].x -
                      (long)pQVar6[uVar2].x) <
                      ((long)pQVar6[puVar5[lVar16 + iVar22]].x - (long)pQVar6[uVar2].x) *
                      ((long)pQVar6[puVar5[local_78.buffer[(long)(local_78.siz + -2)] + lVar16]].y -
                      (long)pQVar6[uVar2].y) != lVar14 < lVar15) break;
                  local_3a = uVar2;
                  QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                            ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                  QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                  local_3a = (this->m_parent->m_indices).d.ptr[(long)this->m_first + (long)iVar22];
                  QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                            ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                  QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                  local_3a = (this->m_parent->m_indices).d.ptr
                             [(long)this->m_first + (long)local_78.buffer[(long)(local_78.siz + -2)]
                             ];
                  QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                            ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                  QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                  puVar1 = (undefined1 *)(local_78.siz + -1);
                  bVar7 = 2 < local_78.siz;
                  local_78.siz = (qsizetype)puVar1;
                } while (bVar7);
              }
              QDataBuffer<int>::reserve(&local_78,(qsizetype)(local_78.siz + 1));
              local_78.buffer[local_78.siz] = iVar22;
              iVar13 = this->m_length;
              bVar7 = false;
              uVar10 = (long)(iVar22 + 1) % (long)iVar13 & 0xffffffff;
            }
            local_78.siz = local_78.siz + 1;
            iVar19 = iVar20 + 3;
            iVar20 = iVar20 + 1;
          } while (iVar19 < iVar13);
        }
        iVar13 = iVar13 + this->m_first + 1;
        pQVar17 = this->m_parent;
      }
      this->m_first = iVar13;
    } while ((long)(iVar13 + 3) <= (pQVar17->m_indices).d.size);
  }
  QArrayDataPointer<unsigned_short>::operator=(&(pQVar17->m_indices).d,&local_58);
  if (local_78.buffer != (int *)0x0) {
    QtPrivate::sizedFree(local_78.buffer,local_78.capacity << 2);
  }
  if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTriangulator<T>::MonotoneToTriangles::decompose()
{
    QList<T> result;
    QDataBuffer<int> stack(m_parent->m_indices.size());
    m_first = 0;
    // Require at least three more indices.
    while (m_first + 3 <= m_parent->m_indices.size()) {
        m_length = 0;
        while (m_parent->m_indices.at(m_first + m_length) != T(-1)) { // Q_TRIANGULATE_END_OF_POLYGON
            ++m_length;
            Q_ASSERT(m_first + m_length < m_parent->m_indices.size());
        }
        if (m_length < 3) {
            m_first += m_length + 1;
            continue;
        }

        int minimum = 0;
        while (less(next(minimum), minimum))
            minimum = next(minimum);
        while (less(previous(minimum), minimum))
            minimum = previous(minimum);

        stack.reset();
        stack.add(minimum);
        int left = previous(minimum);
        int right = next(minimum);
        bool stackIsOnLeftSide;
        bool clockwiseOrder = leftOfEdge(minimum, left, right);

        if (less(left, right)) {
            stack.add(left);
            left = previous(left);
            stackIsOnLeftSide = true;
        } else {
            stack.add(right);
            right = next(right);
            stackIsOnLeftSide = false;
        }

        for (int count = 0; count + 2 < m_length; ++count)
        {
            Q_ASSERT(stack.size() >= 2);
            if (less(left, right)) {
                if (stackIsOnLeftSide == false) {
                    for (int i = 0; i + 1 < stack.size(); ++i) {
                        result.push_back(indices(stack.at(i + 1)));
                        result.push_back(indices(left));
                        result.push_back(indices(stack.at(i)));
                    }
                    stack.first() = stack.last();
                    stack.resize(1);
                } else {
                    while (stack.size() >= 2 && (clockwiseOrder ^ !leftOfEdge(left, stack.at(stack.size() - 2), stack.last()))) {
                        result.push_back(indices(stack.at(stack.size() - 2)));
                        result.push_back(indices(left));
                        result.push_back(indices(stack.last()));
                        stack.pop_back();
                    }
                }
                stack.add(left);
                left = previous(left);
                stackIsOnLeftSide = true;
            } else {
                if (stackIsOnLeftSide == true) {
                    for (int i = 0; i + 1 < stack.size(); ++i) {
                        result.push_back(indices(stack.at(i)));
                        result.push_back(indices(right));
                        result.push_back(indices(stack.at(i + 1)));
                    }
                    stack.first() = stack.last();
                    stack.resize(1);
                } else {
                    while (stack.size() >= 2 && (clockwiseOrder ^ !leftOfEdge(right, stack.last(), stack.at(stack.size() - 2)))) {
                        result.push_back(indices(stack.last()));
                        result.push_back(indices(right));
                        result.push_back(indices(stack.at(stack.size() - 2)));
                        stack.pop_back();
                    }
                }
                stack.add(right);
                right = next(right);
                stackIsOnLeftSide = false;
            }
        }

        m_first += m_length + 1;
    }
    m_parent->m_indices = result;
}